

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

SectionContribution * __thiscall
llvm::DWARFUnitIndex::Entry::getOffset(Entry *this,DWARFSectionKind Sec)

{
  type pDVar1;
  type pSVar2;
  uint local_20;
  uint32_t i;
  DWARFSectionKind Sec_local;
  Entry *this_local;
  
  local_20 = 0;
  while( true ) {
    if (local_20 == (this->Index->Header).NumColumns) {
      return (SectionContribution *)0x0;
    }
    pDVar1 = std::
             unique_ptr<llvm::DWARFSectionKind[],_std::default_delete<llvm::DWARFSectionKind[]>_>::
             operator[](&this->Index->ColumnKinds,(ulong)local_20);
    if (*pDVar1 == Sec) break;
    local_20 = local_20 + 1;
  }
  pSVar2 = std::
           unique_ptr<llvm::DWARFUnitIndex::Entry::SectionContribution[],_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
           ::operator[](&this->Contributions,(ulong)local_20);
  return pSVar2;
}

Assistant:

const DWARFUnitIndex::Entry::SectionContribution *
DWARFUnitIndex::Entry::getOffset(DWARFSectionKind Sec) const {
  uint32_t i = 0;
  for (; i != Index->Header.NumColumns; ++i)
    if (Index->ColumnKinds[i] == Sec)
      return &Contributions[i];
  return nullptr;
}